

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies.cpp
# Opt level: O0

bool bidfx_public_api::price::Currencies::IsValidCurrencyPair(string *ccy_pair)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  string local_70;
  int precedence2;
  string local_40;
  int local_1c;
  string *psStack_18;
  int precedence1;
  string *ccy_pair_local;
  
  psStack_18 = ccy_pair;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (lVar3 = std::__cxx11::string::length(), lVar3 == 6)) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)psStack_18);
    iVar1 = Precedence(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (iVar1 != -1) {
      local_1c = iVar1;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)psStack_18);
      iVar1 = Precedence(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (iVar1 != -1) {
        return local_1c < iVar1;
      }
    }
  }
  return false;
}

Assistant:

bool Currencies::IsValidCurrencyPair(const std::string& ccy_pair)
{
    if (!ccy_pair.empty())
    {
        if (ccy_pair.length() == 6)
        {
            int precedence1 = Precedence(ccy_pair.substr(0, 3));

            if (precedence1 != -1)
            {
                int precedence2 = Precedence(ccy_pair.substr(3, 6));

                if (precedence2 != -1)
                {
                    return precedence1 < precedence2;
                }
            }
        }
    }

    return false;
}